

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cabac.c
# Opt level: O0

int h264_cabac_ueg(bitstream *str,h264_cabac_context *cabac,int *ctxIdx,int numidx,int k,int sign,
                  uint32_t uCoff,int32_t *val)

{
  int iVar1;
  uint uVar2;
  int *in_RDI;
  int in_R8D;
  int in_R9D;
  bool bVar3;
  uint32_t s;
  uint32_t tmp_1;
  uint32_t tmp;
  uint32_t sufS;
  uint32_t rval;
  uint32_t tuval;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  undefined4 uVar4;
  uint in_stack_ffffffffffffffc8;
  uint32_t local_30;
  int local_28;
  int local_4;
  
  local_30 = *(uint *)CONCAT44(rval,sufS);
  if ((int)local_30 < 1) {
    local_30 = -local_30;
  }
  if (tmp_1 < local_30) {
    local_30 = tmp_1;
  }
  iVar1 = h264_cabac_tu((bitstream *)ctxIdx,(h264_cabac_context *)CONCAT44(numidx,k),
                        (int *)CONCAT44(sign,tuval),rval,sufS,(uint32_t *)CONCAT44(tmp,tmp_1));
  if (iVar1 == 0) {
    if (local_30 < tmp_1) {
LAB_0010f9fe:
      if ((local_30 == 0) || (in_R9D == 0)) {
        if (*in_RDI == 1) {
          *(uint32_t *)CONCAT44(rval,sufS) = local_30;
        }
      }
      else {
        bVar3 = *(int *)CONCAT44(rval,sufS) < 0;
        uVar2 = (uint)bVar3;
        iVar1 = h264_cabac_bypass((bitstream *)CONCAT44(local_30,in_stack_ffffffffffffffc8),
                                  (h264_cabac_context *)
                                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                  (uint32_t *)(ulong)CONCAT14(bVar3,in_stack_ffffffffffffffb8));
        if (iVar1 != 0) {
          return 1;
        }
        if (*in_RDI == 1) {
          if (uVar2 == 0) {
            *(uint32_t *)CONCAT44(rval,sufS) = local_30;
          }
          else {
            *(uint32_t *)CONCAT44(rval,sufS) = -local_30;
          }
        }
      }
      local_4 = 0;
    }
    else {
      local_28 = in_R8D;
      if (*in_RDI == 0) {
        local_30 = *(uint *)CONCAT44(rval,sufS);
        if ((int)local_30 < 1) {
          local_30 = -local_30;
        }
        in_stack_ffffffffffffffc8 = local_30 - tmp_1;
        uVar4 = 1;
        for (; (uint)(1 << ((byte)local_28 & 0x1f)) <= in_stack_ffffffffffffffc8;
            local_28 = local_28 + 1) {
          iVar1 = h264_cabac_bypass((bitstream *)CONCAT44(local_30,in_stack_ffffffffffffffc8),
                                    (h264_cabac_context *)CONCAT44(uVar4,in_stack_ffffffffffffffc0),
                                    (uint32_t *)
                                    CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
          if (iVar1 != 0) {
            return 1;
          }
          in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 - (1 << ((byte)local_28 & 0x1f));
        }
        in_stack_ffffffffffffffc4 = 0;
        iVar1 = h264_cabac_bypass((bitstream *)CONCAT44(local_30,in_stack_ffffffffffffffc8),
                                  (h264_cabac_context *)(ulong)in_stack_ffffffffffffffc0,
                                  (uint32_t *)
                                  CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        if (iVar1 == 0) {
          do {
            if (local_28 == 0) goto LAB_0010f9fe;
            uVar2 = in_stack_ffffffffffffffc8 >> ((byte)(local_28 + -1) & 0x1f);
            in_stack_ffffffffffffffc4 = uVar2 & 1;
            iVar1 = h264_cabac_bypass((bitstream *)CONCAT44(local_30,in_stack_ffffffffffffffc8),
                                      (h264_cabac_context *)
                                      (CONCAT44(uVar2,in_stack_ffffffffffffffc0) & 0x1ffffffff),
                                      (uint32_t *)
                                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
            ;
            local_28 = local_28 + -1;
          } while (iVar1 == 0);
          local_4 = 1;
        }
        else {
          local_4 = 1;
        }
      }
      else {
LAB_0010f95d:
        iVar1 = h264_cabac_bypass((bitstream *)CONCAT44(local_30,in_stack_ffffffffffffffc8),
                                  (h264_cabac_context *)
                                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                  (uint32_t *)
                                  CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        if (iVar1 == 0) {
          if (in_stack_ffffffffffffffc0 != 0) goto LAB_0010f98c;
          in_stack_ffffffffffffffc0 = 0;
          while (local_28 != 0) {
            iVar1 = h264_cabac_bypass((bitstream *)CONCAT44(local_30,in_stack_ffffffffffffffc8),
                                      (h264_cabac_context *)
                                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                      (uint32_t *)
                                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
            ;
            if (iVar1 != 0) {
              return 1;
            }
            local_30 = (in_stack_ffffffffffffffc0 << ((byte)(local_28 + -1) & 0x1f)) + local_30;
            local_28 = local_28 + -1;
          }
          goto LAB_0010f9fe;
        }
        local_4 = 1;
      }
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
LAB_0010f98c:
  local_30 = (1 << ((byte)local_28 & 0x1f)) + local_30;
  local_28 = local_28 + 1;
  goto LAB_0010f95d;
}

Assistant:

int h264_cabac_ueg(struct bitstream *str, struct h264_cabac_context *cabac, int *ctxIdx, int numidx, int k, int sign, uint32_t uCoff, int32_t *val) {
	uint32_t tuval = abs(*val);
	if (tuval > uCoff)
		tuval = uCoff;
	if (h264_cabac_tu(str, cabac, ctxIdx, numidx, uCoff, &tuval)) return 1;
	uint32_t rval = tuval;
	if (tuval >= uCoff) {
		if (str->dir == VS_ENCODE) {
			rval = abs(*val);
			uint32_t sufS = rval - uCoff;
			uint32_t tmp = 1;
			while (sufS >= (1 << k)) {
				if (h264_cabac_bypass(str, cabac, &tmp)) return 1;
				sufS -= 1 << k;
				k++;
			}
			tmp = 0;
			if (h264_cabac_bypass(str, cabac, &tmp)) return 1;
			while (k--) {
				tmp = sufS >> k & 1;
				if (h264_cabac_bypass(str, cabac, &tmp)) return 1;
			}
		} else {
			uint32_t tmp;
			while (1) {
				if (h264_cabac_bypass(str, cabac, &tmp)) return 1;
				if (!tmp)
					break;
				rval += 1 << k;
				k++;
			}
			while (k--) {
				if (h264_cabac_bypass(str, cabac, &tmp)) return 1;
				rval += tmp << k;
			}
		}
	}
	if (rval && sign) {
		uint32_t s = *val < 0;
		if (h264_cabac_bypass(str, cabac, &s)) return 1;
		if (str->dir == VS_DECODE) {
			if (s)
				*val = -rval;
			else
				*val = rval;
		}
	} else {
		if (str->dir == VS_DECODE)
			*val = rval;
	}
	return 0;
}